

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O3

PrgDisj * __thiscall
Clasp::Asp::LogicProgram::getDisjFor(LogicProgram *this,AtomSpan *head,uint32 headHash)

{
  byte *pbVar1;
  uint *puVar2;
  PrgNode PVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var4;
  PrgDisj *pPVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>_>
  pVar9;
  PrgDisj *d;
  uint32 local_3c;
  PrgDisj *local_38;
  uint32 local_30;
  uint local_2c;
  
  local_38 = (PrgDisj *)0x0;
  local_3c = headHash;
  if (headHash != 0) {
    pVar9 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
            ::equal_range(&(this->index_->disj)._M_h,&local_3c);
    _Var4._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                   _M_cur;
    if ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var4._M_cur ==
        pVar9.second.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
        _M_cur.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>) {
      sVar6 = head->size;
    }
    else {
      sVar6 = head->size;
      do {
        pPVar5 = (this->disjunctions_).ebo_.buf
                 [*(uint *)((long)&((_Var4._M_cur)->
                                   super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                   ._M_storage._M_storage + 4)];
        if ((((pPVar5->super_PrgHead).super_PrgNode.field_0x7 & 0x40) == 0) &&
           (uVar7 = *(uint *)&(pPVar5->super_PrgHead).field_0x18 & 0x7ffffff, sVar6 == uVar7)) {
          if (uVar7 == 0) goto LAB_0013fbce;
          lVar8 = 0;
          while ((uVar7 = *(uint *)(&(pPVar5->super_PrgHead).field_0x1c + lVar8),
                 uVar7 < (this->atomState_).state_.ebo_.size &&
                 (((this->atomState_).state_.ebo_.buf[uVar7] & 4) != 0))) {
            lVar8 = lVar8 + 4;
            if (sVar6 * 4 - lVar8 == 0) goto LAB_0013fbce;
          }
        }
        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)_Var4._M_cur
               != pVar9.second.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>);
    }
    pPVar5 = (PrgDisj *)0x0;
LAB_0013fbce:
    if (sVar6 != 0) {
      puVar2 = head->first;
      lVar8 = 0;
      do {
        uVar7 = *(uint *)((long)puVar2 + lVar8);
        if (uVar7 < (this->atomState_).state_.ebo_.size) {
          pbVar1 = (this->atomState_).state_.ebo_.buf + uVar7;
          *pbVar1 = *pbVar1 & 0xe0;
        }
        lVar8 = lVar8 + 4;
      } while (sVar6 * 4 != lVar8);
    }
    if (pPVar5 != (PrgDisj *)0x0) {
      return pPVar5;
    }
  }
  *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) =
       *(int *)(&this->field_0x64 + (long)this->statsId_ * 4) + 1;
  local_38 = PrgDisj::create((this->disjunctions_).ebo_.size,head);
  bk_lib::pod_vector<Clasp::Asp::PrgDisj_*,_std::allocator<Clasp::Asp::PrgDisj_*>_>::push_back
            (&this->disjunctions_,&local_38);
  sVar6 = head->size;
  if (sVar6 != 0) {
    PVar3 = (local_38->super_PrgHead).super_PrgNode;
    uVar7 = *(uint *)&(local_38->super_PrgHead).field_0x18;
    puVar2 = head->first;
    lVar8 = 0;
    do {
      PrgHead::addSupport(&(this->atoms_).ebo_.buf[*(uint *)((long)puVar2 + lVar8)]->super_PrgHead,
                          (PrgEdge)(((uint)((ulong)PVar3 >> 0x1c) & 0xfffffff0) +
                                    ((int)~uVar7 >> 0x1f) * -8 + 2),force_simplify);
      lVar8 = lVar8 + 4;
    } while (sVar6 << 2 != lVar8);
  }
  if (local_3c != 0) {
    local_2c = *(uint *)&(local_38->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff;
    local_30 = local_3c;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&this->index_->disj,0);
  }
  return local_38;
}

Assistant:

PrgDisj* LogicProgram::getDisjFor(const Potassco::AtomSpan& head, uint32 headHash) {
	PrgDisj* d = 0;
	if (headHash) {
		IndexRange eqRange = index_->disj.equal_range(headHash);
		for (; eqRange.first != eqRange.second; ++eqRange.first) {
			PrgDisj& o = *disjunctions_[eqRange.first->second];
			if (o.relevant() && o.size() == Potassco::size(head) && atomState_.allMarked(o.begin(), o.end(), AtomState::head_flag)) {
				assert(o.id() == eqRange.first->second);
				d = &o;
				break;
			}
		}
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			atomState_.clearRule(*it);
		}
	}
	if (!d) {
		// no corresponding disjunction exists, create a new object
		// and link it to all atoms
		++stats.disjunctions[statsId_];
		d = PrgDisj::create((uint32)disjunctions_.size(), head);
		disjunctions_.push_back(d);
		PrgEdge edge = PrgEdge::newEdge(*d, PrgEdge::Choice);
		for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
			getAtom(*it)->addSupport(edge);
		}
		if (headHash) {
			index_->disj.insert(IndexMap::value_type(headHash, d->id()));
		}
	}
	return d;
}